

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::Direction>
metaf::Direction::fromCardinalString(string *s,bool enableOhdAlqds,bool enableUnknown)

{
  int iVar1;
  _Storage<metaf::Direction,_true> in_RAX;
  undefined4 uVar2;
  undefined8 unaff_RBX;
  uint uVar3;
  uint uVar4;
  optional<metaf::Direction> oVar5;
  
  if (s->_M_string_length == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    uVar2 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (iVar1 == 0) {
      in_RAX = (_Storage<metaf::Direction,_true>)0x200000000;
    }
    else {
      if (enableOhdAlqds) {
        iVar1 = std::__cxx11::string::compare((char *)s);
        if (iVar1 == 0) {
          in_RAX = (_Storage<metaf::Direction,_true>)0x500000000;
          goto LAB_001a8809;
        }
        iVar1 = std::__cxx11::string::compare((char *)s);
        if (iVar1 == 0) {
          in_RAX = (_Storage<metaf::Direction,_true>)0x600000000;
          goto LAB_001a8809;
        }
      }
      if (enableUnknown) {
        iVar1 = std::__cxx11::string::compare((char *)s);
        if (iVar1 == 0) {
          in_RAX = (_Storage<metaf::Direction,_true>)0x700000000;
          goto LAB_001a8809;
        }
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar3 = 0x168;
      if (iVar1 != 0) {
        uVar3 = 0;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar4 = 0x10e;
      if (iVar1 != 0) {
        uVar4 = uVar3;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar3 = 0xb4;
      if (iVar1 != 0) {
        uVar3 = uVar4;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar4 = 0x5a;
      if (iVar1 != 0) {
        uVar4 = uVar3;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar3 = 0x13b;
      if (iVar1 != 0) {
        uVar3 = uVar4;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar4 = 0x2d;
      if (iVar1 != 0) {
        uVar4 = uVar3;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      uVar3 = 0xe1;
      if (iVar1 != 0) {
        uVar3 = uVar4;
      }
      iVar1 = std::__cxx11::string::compare((char *)s);
      in_RAX = (_Storage<metaf::Direction,_true>)0x87;
      if (iVar1 != 0) {
        in_RAX._M_value.dirType = 0;
        in_RAX._M_value.dirDegrees = uVar3;
      }
      if (in_RAX._M_value.dirDegrees == 0) {
        uVar2 = 0;
      }
      else {
        in_RAX._M_value = in_RAX._M_value | 0x400000000;
      }
    }
  }
LAB_001a8809:
  oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Direction>._8_4_ = uVar2;
  oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Direction>._M_payload = in_RAX;
  return (optional<metaf::Direction>)
         oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction>;
}

Assistant:

TrendGroup() = default;